

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

StructSchema __thiscall capnp::Schema::asStruct(Schema *this)

{
  bool bVar1;
  Reader local_98;
  ArrayPtr<const_char> local_68;
  Fault local_58;
  Fault f;
  bool local_1a;
  DebugExpression<bool> local_19;
  Schema *pSStack_18;
  DebugExpression<bool> _kjCondition;
  Schema *this_local;
  
  pSStack_18 = this;
  getProto((Reader *)&f,this);
  local_1a = capnp::schema::Node::Reader::isStruct((Reader *)&f);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (bVar1) {
    StructSchema::StructSchema((StructSchema *)&this_local,(Schema)this->raw);
  }
  else {
    getProto(&local_98,this);
    local_68 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_98);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44],capnp::Text::Reader>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x11b,FAILED,"getProto().isStruct()",
               "_kjCondition,\"Tried to use non-struct schema as a struct.\", getProto().getDisplayName()"
               ,&local_19,(char (*) [44])"Tried to use non-struct schema as a struct.",
               (Reader *)&local_68);
    StructSchema::StructSchema((StructSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  return (StructSchema)(Schema)this_local;
}

Assistant:

StructSchema Schema::asStruct() const {
  KJ_REQUIRE(getProto().isStruct(), "Tried to use non-struct schema as a struct.",
             getProto().getDisplayName()) {
    return StructSchema();
  }
  return StructSchema(*this);
}